

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O0

void mbedtls_md_free(mbedtls_md_context_t *ctx)

{
  long *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if ((in_RDI != (long *)0x0) && (*in_RDI != 0)) {
    if (in_RDI[1] != 0) {
      in_stack_fffffffffffffff4 = *(int *)*in_RDI;
      if (in_stack_fffffffffffffff4 == 5) {
        mbedtls_sha1_free((mbedtls_sha1_context *)0x87dc0b);
      }
      else if (in_stack_fffffffffffffff4 == 9) {
        mbedtls_sha256_free((mbedtls_sha256_context *)0x87dc1b);
      }
      free((void *)in_RDI[1]);
    }
    if (in_RDI[2] != 0) {
      mbedtls_zeroize_and_free
                ((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffe8);
    }
    mbedtls_platform_zeroize
              ((void *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void mbedtls_md_free(mbedtls_md_context_t *ctx)
{
    if (ctx == NULL || ctx->md_info == NULL) {
        return;
    }

    if (ctx->md_ctx != NULL) {
#if defined(MBEDTLS_MD_SOME_PSA)
        if (ctx->engine == MBEDTLS_MD_ENGINE_PSA) {
            psa_hash_abort(ctx->md_ctx);
        } else
#endif
        switch (ctx->md_info->type) {
#if defined(MBEDTLS_MD5_C)
            case MBEDTLS_MD_MD5:
                mbedtls_md5_free(ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
            case MBEDTLS_MD_RIPEMD160:
                mbedtls_ripemd160_free(ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_SHA1_C)
            case MBEDTLS_MD_SHA1:
                mbedtls_sha1_free((mbedtls_sha1_context *)ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_SHA224_C)
            case MBEDTLS_MD_SHA224:
                mbedtls_sha256_free((mbedtls_sha256_context *)ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_SHA256_C)
            case MBEDTLS_MD_SHA256:
                mbedtls_sha256_free((mbedtls_sha256_context *)ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_SHA384_C)
            case MBEDTLS_MD_SHA384:
                mbedtls_sha512_free(ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_SHA512_C)
            case MBEDTLS_MD_SHA512:
                mbedtls_sha512_free(ctx->md_ctx);
                break;
#endif
#if defined(MBEDTLS_SHA3_C)
            case MBEDTLS_MD_SHA3_224:
            case MBEDTLS_MD_SHA3_256:
            case MBEDTLS_MD_SHA3_384:
            case MBEDTLS_MD_SHA3_512:
                mbedtls_sha3_free(ctx->md_ctx);
                break;
#endif
            default:
                /* Shouldn't happen */
                break;
        }
        mbedtls_free(ctx->md_ctx);
    }

#if defined(MBEDTLS_MD_C)
    if (ctx->hmac_ctx != NULL) {
        mbedtls_zeroize_and_free(ctx->hmac_ctx,
                                 2 * ctx->md_info->block_size);
    }
#endif

    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_md_context_t));
}